

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

int __thiscall cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  DependSetList *this_00;
  reference ppDVar4;
  bool local_d1;
  undefined1 local_c8 [8];
  BFSEntry qe_1;
  char *val;
  string var;
  BFSEntry qe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  reference local_48;
  LinkEntry *entry;
  iterator iStack_38;
  int index;
  _Self local_30;
  _Self local_28;
  iterator lei;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  
  lei._M_node = (_Base_ptr)item;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->LinkEntryIndex,&item->super_string);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->LinkEntryIndex);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    iStack_38 = AllocateLinkEntry(this,lei._M_node);
    local_28._M_node = iStack_38._M_node;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    entry._4_4_ = ppVar2->second;
    local_48 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(long)entry._4_4_);
    std::__cxx11::string::operator=((string *)local_48,(string *)lei._M_node);
    local_48->Target = *(cmGeneratorTarget **)(lei._M_node + 1);
    bVar1 = false;
    local_d1 = false;
    if (local_48->Target == (cmGeneratorTarget *)0x0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)lei._M_node);
      local_d1 = false;
      if (*pcVar3 == '-') {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)lei._M_node);
        local_d1 = false;
        if (*pcVar3 != 'l') {
          std::__cxx11::string::substr((ulong)&local_68,(ulong)lei._M_node);
          bVar1 = true;
          local_d1 = std::operator!=(&local_68,"-framework");
        }
      }
    }
    local_48->IsFlag = local_d1;
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (local_48->Target == (cmGeneratorTarget *)0x0) {
      std::__cxx11::string::string((string *)&val,(string *)local_48);
      std::__cxx11::string::operator+=((string *)&val,"_LIB_DEPENDS");
      qe_1.LibDepends = cmMakefile::GetDefinition(this->Makefile,(string *)&val);
      if (qe_1.LibDepends == (char *)0x0) {
        if ((local_48->IsFlag & 1U) == 0) {
          this_00 = (DependSetList *)operator_new(0x18);
          DependSetList::DependSetList(this_00);
          ppDVar4 = std::
                    vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                    ::operator[](&this->InferredDependSets,(long)entry._4_4_);
          *ppDVar4 = this_00;
        }
      }
      else {
        local_c8._0_4_ = entry._4_4_;
        qe_1._0_8_ = qe_1.LibDepends;
        std::
        queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
        ::push(&this->BFSQueue,(value_type *)local_c8);
      }
      std::__cxx11::string::~string((string *)&val);
    }
    else {
      var.field_2._8_4_ = entry._4_4_;
      std::
      queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
      ::push(&this->BFSQueue,(value_type *)((long)&var.field_2 + 8));
    }
    this_local._4_4_ = entry._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item)
{
  // Check if the item entry has already been added.
  std::map<std::string, int>::iterator lei = this->LinkEntryIndex.find(item);
  if (lei != this->LinkEntryIndex.end()) {
    // Yes.  We do not need to follow the item's dependencies again.
    return lei->second;
  }

  // Allocate a spot for the item entry.
  lei = this->AllocateLinkEntry(item);

  // Initialize the item entry.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = item;
  entry.Target = item.Target;
  entry.IsFlag = (!entry.Target && item[0] == '-' && item[1] != 'l' &&
                  item.substr(0, 10) != "-framework");

  // If the item has dependencies queue it to follow them.
  if (entry.Target) {
    // Target dependencies are always known.  Follow them.
    BFSEntry qe = { index, CM_NULLPTR };
    this->BFSQueue.push(qe);
  } else {
    // Look for an old-style <item>_LIB_DEPENDS variable.
    std::string var = entry.Item;
    var += "_LIB_DEPENDS";
    if (const char* val = this->Makefile->GetDefinition(var)) {
      // The item dependencies are known.  Follow them.
      BFSEntry qe = { index, val };
      this->BFSQueue.push(qe);
    } else if (!entry.IsFlag) {
      // The item dependencies are not known.  We need to infer them.
      this->InferredDependSets[index] = new DependSetList;
    }
  }

  return index;
}